

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcompleter_p.cpp
# Opt level: O2

void QCompletionModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != IndexOfMethod) {
    if (_c == InvokeMetaMethod) {
      switch(_id) {
      case 0:
        rowsAdded((QCompletionModel *)_o);
        return;
      case 1:
        invalidate((QCompletionModel *)_o);
        return;
      case 2:
        rowsInserted((QCompletionModel *)_o);
        return;
      case 3:
        modelDestroyed((QCompletionModel *)_o);
        return;
      }
    }
    return;
  }
  QtMocHelpers::indexOfMethod<void(QCompletionModel::*)()>
            ((QtMocHelpers *)_a,(void **)rowsAdded,0,0);
  return;
}

Assistant:

void QCompletionModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCompletionModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rowsAdded(); break;
        case 1: _t->invalidate(); break;
        case 2: _t->rowsInserted(); break;
        case 3: _t->modelDestroyed(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCompletionModel::*)()>(_a, &QCompletionModel::rowsAdded, 0))
            return;
    }
}